

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

void highbd_resize_multistep
               (uint16_t *input,int length,uint16_t *output,int olength,uint16_t *otmp,int bd)

{
  int iVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ushort *puVar6;
  uint uVar7;
  int iVar8;
  uint16_t *puVar9;
  long lVar10;
  ushort *puVar11;
  uint16_t *puVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint16_t *puVar21;
  uint16_t *local_98;
  uint16_t *local_78;
  
  if (length == olength) {
    memcpy(output,input,(long)length * 2);
    return;
  }
  uVar3 = get_down2_steps(length,olength);
  if (0 < (int)uVar3) {
    iVar1 = length + 1;
    local_78 = (uint16_t *)0x0;
    for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      uVar17 = (int)(length + 1U) >> 1;
      if (uVar7 == 0) {
        local_78 = input;
      }
      puVar9 = otmp + (int)(-(uVar7 & 1) & iVar1 >> 1);
      if (uVar17 == olength && uVar7 == uVar3 - 1) {
        puVar9 = output;
      }
      if ((length & 1U) == 0) {
        if (length < 8) {
          iVar13 = 1;
          puVar12 = puVar9;
          for (uVar20 = 0; (long)uVar20 < (long)length; uVar20 = uVar20 + 2) {
            uVar5 = uVar20 & 0xffffffff;
            iVar18 = 0x40;
            iVar8 = iVar13;
            for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 2) {
              uVar16 = 0;
              if (0 < (int)uVar5) {
                uVar16 = uVar5;
              }
              iVar19 = length - 1U;
              if (iVar8 < (int)(length - 1U)) {
                iVar19 = iVar8;
              }
              iVar18 = iVar18 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar15) *
                                ((uint)local_78[iVar19] + (uint)local_78[uVar16]);
              iVar8 = iVar8 + 1;
              uVar5 = (ulong)((int)uVar5 - 1);
            }
            uVar2 = clip_pixel_highbd(iVar18 >> 7,bd);
            *puVar12 = uVar2;
            puVar12 = puVar12 + 1;
            iVar13 = iVar13 + 2;
          }
        }
        else {
          puVar12 = local_78 + 1;
          local_98 = puVar9;
          for (uVar20 = 0; uVar20 < 4; uVar20 = uVar20 + 2) {
            uVar5 = uVar20 & 0xffffffff;
            iVar13 = 0x40;
            for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 2) {
              uVar16 = 0;
              if (0 < (int)uVar5) {
                uVar16 = uVar5;
              }
              iVar13 = iVar13 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar15) *
                                ((uint)*(ushort *)((long)puVar12 + lVar15) + (uint)local_78[uVar16])
              ;
              uVar5 = (ulong)((int)uVar5 - 1);
            }
            uVar2 = clip_pixel_highbd(iVar13 >> 7,bd);
            *local_98 = uVar2;
            local_98 = local_98 + 1;
            puVar12 = puVar12 + 2;
          }
          puVar12 = local_78 + 5;
          puVar11 = local_78 + 4;
          iVar13 = 5;
          for (uVar20 = 4; uVar20 < length - 4; uVar20 = uVar20 + 2) {
            iVar18 = 0x40;
            puVar6 = puVar11;
            for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 2) {
              iVar18 = iVar18 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar15) *
                                ((uint)*(ushort *)((long)puVar12 + lVar15) + (uint)*puVar6);
              puVar6 = puVar6 + -1;
            }
            uVar2 = clip_pixel_highbd(iVar18 >> 7,bd);
            *local_98 = uVar2;
            local_98 = local_98 + 1;
            puVar12 = puVar12 + 2;
            puVar11 = puVar11 + 2;
            iVar13 = iVar13 + 2;
          }
          for (; uVar20 < (uint)length; uVar20 = uVar20 + 2) {
            iVar18 = 0x40;
            puVar6 = puVar11;
            iVar8 = iVar13;
            for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 2) {
              iVar19 = length - 1U;
              if (iVar8 < (int)(length - 1U)) {
                iVar19 = iVar8;
              }
              iVar18 = iVar18 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar15) *
                                ((uint)local_78[iVar19] + (uint)*puVar6);
              iVar8 = iVar8 + 1;
              puVar6 = puVar6 + -1;
            }
            uVar2 = clip_pixel_highbd(iVar18 >> 7,bd);
            *local_98 = uVar2;
            local_98 = local_98 + 1;
            iVar13 = iVar13 + 2;
            puVar11 = puVar11 + 2;
          }
        }
      }
      else if (length < 7) {
        uVar14 = 0xffffffff;
        iVar13 = 1;
        puVar12 = puVar9;
        for (lVar15 = 0; lVar15 < length; lVar15 = lVar15 + 2) {
          iVar18 = (uint)local_78[lVar15] * 0x40 + 0x40;
          uVar4 = uVar14;
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            uVar20 = 0;
            if (0 < (int)uVar4) {
              uVar20 = (ulong)uVar4;
            }
            iVar8 = (int)lVar10 + iVar13;
            if ((int)(length - 1U) <= iVar8) {
              iVar8 = length - 1U;
            }
            iVar18 = iVar18 + (int)av1_down2_symodd_half_filter[lVar10 + 1] *
                              ((uint)local_78[iVar8] + (uint)local_78[uVar20]);
            uVar4 = uVar4 - 1;
          }
          uVar2 = clip_pixel_highbd(iVar18 >> 7,bd);
          *puVar12 = uVar2;
          puVar12 = puVar12 + 1;
          iVar13 = iVar13 + 2;
          uVar14 = uVar14 + 2;
        }
      }
      else {
        uVar14 = 0xffffffff;
        puVar12 = puVar9;
        puVar21 = local_78;
        for (uVar20 = 0; uVar20 < 4; uVar20 = uVar20 + 2) {
          iVar13 = (uint)local_78[uVar20] * 0x40 + 0x40;
          uVar4 = uVar14;
          for (lVar15 = 1; lVar15 != 4; lVar15 = lVar15 + 1) {
            uVar5 = 0;
            if (0 < (int)uVar4) {
              uVar5 = (ulong)uVar4;
            }
            iVar13 = iVar13 + (int)av1_down2_symodd_half_filter[lVar15] *
                              ((uint)puVar21[lVar15] + (uint)local_78[uVar5]);
            uVar4 = uVar4 - 1;
          }
          uVar2 = clip_pixel_highbd(iVar13 >> 7,bd);
          *puVar12 = uVar2;
          puVar12 = puVar12 + 1;
          puVar21 = puVar21 + 2;
          uVar14 = uVar14 + 2;
        }
        puVar11 = local_78 + 3;
        iVar13 = 4;
        puVar21 = local_78;
        for (uVar20 = 4; uVar20 < length - 3; uVar20 = uVar20 + 2) {
          iVar18 = (uint)local_78[uVar20] * 0x40 + 0x40;
          lVar10 = 5;
          for (lVar15 = 6; lVar15 != 0; lVar15 = lVar15 + -2) {
            iVar18 = iVar18 + (int)av1_down2_symeven_half_filter[lVar10] *
                              ((uint)puVar21[lVar10] + (uint)*(ushort *)((long)puVar21 + lVar15));
            lVar10 = lVar10 + 1;
          }
          uVar2 = clip_pixel_highbd(iVar18 >> 7,bd);
          *puVar12 = uVar2;
          puVar12 = puVar12 + 1;
          puVar21 = puVar21 + 2;
          iVar13 = iVar13 + 2;
          puVar11 = puVar11 + 2;
        }
        iVar13 = iVar13 + 1;
        for (; uVar20 < (uint)length; uVar20 = uVar20 + 2) {
          iVar18 = (uint)local_78[uVar20] * 0x40 + 0x40;
          puVar6 = puVar11;
          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
            iVar8 = (int)lVar15 + iVar13;
            if ((int)(length - 1U) <= iVar8) {
              iVar8 = length - 1U;
            }
            iVar18 = iVar18 + (int)av1_down2_symodd_half_filter[lVar15 + 1] *
                              ((uint)local_78[iVar8] + (uint)*puVar6);
            puVar6 = puVar6 + -1;
          }
          uVar2 = clip_pixel_highbd(iVar18 >> 7,bd);
          *puVar12 = uVar2;
          puVar12 = puVar12 + 1;
          iVar13 = iVar13 + 2;
          puVar11 = puVar11 + 2;
        }
      }
      length = uVar17;
      local_78 = puVar9;
    }
    input = local_78;
    if (length == olength) {
      return;
    }
  }
  highbd_interpolate(input,length,output,olength,bd);
  return;
}

Assistant:

static void highbd_resize_multistep(const uint16_t *const input, int length,
                                    uint16_t *output, int olength,
                                    uint16_t *otmp, int bd) {
  if (length == olength) {
    memcpy(output, input, sizeof(output[0]) * length);
    return;
  }
  const int steps = get_down2_steps(length, olength);

  if (steps > 0) {
    uint16_t *out = NULL;
    int filteredlength = length;

    assert(otmp != NULL);
    uint16_t *otmp2 = otmp + get_down2_length(length, 1);
    for (int s = 0; s < steps; ++s) {
      const int proj_filteredlength = get_down2_length(filteredlength, 1);
      const uint16_t *const in = (s == 0 ? input : out);
      if (s == steps - 1 && proj_filteredlength == olength)
        out = output;
      else
        out = (s & 1 ? otmp2 : otmp);
      if (filteredlength & 1)
        highbd_down2_symodd(in, filteredlength, out, bd);
      else
        highbd_down2_symeven(in, filteredlength, out, bd);
      filteredlength = proj_filteredlength;
    }
    if (filteredlength != olength) {
      highbd_interpolate(out, filteredlength, output, olength, bd);
    }
  } else {
    highbd_interpolate(input, length, output, olength, bd);
  }
}